

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long mkvparser::Track::Create
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               Track **pResult)

{
  int iVar1;
  Track *this;
  long lVar2;
  
  lVar2 = -1;
  if (*pResult == (Track *)0x0) {
    this = (Track *)operator_new(0xc0,(nothrow_t *)&std::nothrow);
    if (this == (Track *)0x0) {
      this = (Track *)0x0;
    }
    else {
      Track(this,pSegment,element_start,element_size);
    }
    if (this != (Track *)0x0) {
      iVar1 = Info::Copy(info,&this->m_info);
      if (iVar1 == 0) {
        *pResult = this;
        lVar2 = 0;
      }
      else {
        (*this->_vptr_Track[1])(this);
        lVar2 = (long)iVar1;
      }
    }
  }
  return lVar2;
}

Assistant:

long Track::Create(Segment* pSegment, const Info& info, long long element_start,
                   long long element_size, Track*& pResult) {
  if (pResult)
    return -1;

  Track* const pTrack =
      new (std::nothrow) Track(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pResult = pTrack;
  return 0;  // success
}